

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicOneWorkGroup::RunIteration
          (BasicOneWorkGroup *this,int param_1,int param_2,int param_3,GLuint binding,
          bool dispatch_indirect)

{
  bool bVar1;
  GLuint GVar2;
  Vector<unsigned_int,_4> local_b4;
  Vector<unsigned_int,_4> local_a4;
  uint local_94;
  uint local_90;
  int index;
  int x;
  int y;
  int z;
  bool ret;
  uvec4 *data;
  GLuint num_groups [3];
  int kSize;
  GLint v [3];
  string local_50;
  byte local_29;
  GLuint local_28;
  int iStack_24;
  bool dispatch_indirect_local;
  GLuint binding_local;
  int local_size_z_local;
  int local_size_y_local;
  int local_size_x_local;
  BasicOneWorkGroup *this_local;
  
  local_29 = dispatch_indirect;
  local_28 = binding;
  iStack_24 = param_3;
  binding_local = param_2;
  local_size_z_local = param_1;
  _local_size_y_local = this;
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  gl4cts::(anonymous_namespace)::BasicOneWorkGroup::GenSource_abi_cxx11_
            (&local_50,this,local_size_z_local,binding_local,iStack_24,local_28);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_50);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_50);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    glu::CallLogWrapper::glGetProgramiv
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program,0x8267,(GLint *)(num_groups + 2));
    if (((num_groups[2] == local_size_z_local) && (kSize == binding_local)) && (v[0] == iStack_24))
    {
      num_groups[1] = local_size_z_local * binding_local * iStack_24;
      if (this->m_storage_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_storage_buffer);
      }
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,local_28,this->m_storage_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,(long)(int)num_groups[1] << 4,(void *)0x0,0x88e8);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      if ((local_29 & 1) == 0) {
        glu::CallLogWrapper::glDispatchCompute
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,1,1);
      }
      else {
        data = (uvec4 *)0x100000001;
        num_groups[0] = 1;
        if (this->m_dispatch_buffer == 0) {
          glu::CallLogWrapper::glGenBuffers
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,1,&this->m_dispatch_buffer);
        }
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90ee,this->m_dispatch_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90ee,0xc,&data,0x88e4);
        glu::CallLogWrapper::glDispatchComputeIndirect
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
      }
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      _z = glu::CallLogWrapper::glMapBufferRange
                     (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                       super_CallLogWrapper,0x90d2,0,(long)(int)num_groups[1] << 4,1);
      y._3_1_ = 1;
      for (x = 0; x < iStack_24; x = x + 1) {
        for (index = 0; index < (int)binding_local; index = index + 1) {
          for (local_90 = 0; (int)local_90 < local_size_z_local; local_90 = local_90 + 1) {
            local_94 = x * local_size_z_local * binding_local + index * local_size_z_local +
                       local_90;
            tcu::Vector<unsigned_int,_4>::Vector
                      (&local_a4,(Vector<unsigned_int,_4> *)((long)_z + (long)(int)local_94 * 0x10))
            ;
            tcu::Vector<unsigned_int,_4>::Vector(&local_b4,local_90,index,x,0);
            bVar1 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_a4,&local_b4);
            if (!bVar1) {
              anon_unknown_0::Output("Invalid data at offset %d.\n",(ulong)local_94);
              y._3_1_ = 0;
            }
          }
        }
      }
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0);
      this_local._7_1_ = (bool)(y._3_1_ & 1);
    }
    else {
      anon_unknown_0::Output
                ("GL_COMPUTE_LOCAL_WORK_SIZE is (%d %d %d) should be (%d %d %d)\n",
                 (ulong)num_groups[2],(ulong)(uint)kSize,(ulong)(uint)v[0],
                 (ulong)(uint)local_size_z_local,(ulong)binding_local,iStack_24);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RunIteration(int local_size_x, int local_size_y, int local_size_z, GLuint binding, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size_x, local_size_y, local_size_z, binding));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		GLint v[3];
		glGetProgramiv(m_program, GL_COMPUTE_WORK_GROUP_SIZE, v);
		if (v[0] != local_size_x || v[1] != local_size_y || v[2] != local_size_z)
		{
			Output("GL_COMPUTE_LOCAL_WORK_SIZE is (%d %d %d) should be (%d %d %d)\n", v[0], v[1], v[2], local_size_x,
				   local_size_y, local_size_z);
			return false;
		}

		const int kSize = local_size_x * local_size_y * local_size_z;

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, binding, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(uvec4) * kSize, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint num_groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), num_groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}

		uvec4* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		data =
			static_cast<uvec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * sizeof(uvec4), GL_MAP_READ_BIT));

		bool ret = true;

		for (int z = 0; z < local_size_z; ++z)
		{
			for (int y = 0; y < local_size_y; ++y)
			{
				for (int x = 0; x < local_size_x; ++x)
				{
					const int index = z * local_size_x * local_size_y + y * local_size_x + x;
					if (!IsEqual(data[index], uvec4(x, y, z, 0)))
					{
						Output("Invalid data at offset %d.\n", index);
						ret = false;
					}
				}
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return ret;
	}